

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall re2::ByteMapBuilder::Mark(ByteMapBuilder *this,int lo,int hi)

{
  int local_8;
  int local_4;
  
  _local_8 = CONCAT44(lo,hi);
  if (hi != 0xff || lo != 0) {
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&this->ranges_,
               &local_4,&local_8);
  }
  return;
}

Assistant:

void ByteMapBuilder::Mark(int lo, int hi) {
  DCHECK_GE(lo, 0);
  DCHECK_GE(hi, 0);
  DCHECK_LE(lo, 255);
  DCHECK_LE(hi, 255);
  DCHECK_LE(lo, hi);

  // Ignore any [0-255] ranges. They cause us to recolor every range, which
  // has no effect on the eventual result and is therefore a waste of time.
  if (lo == 0 && hi == 255)
    return;

  ranges_.emplace_back(lo, hi);
}